

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O2

void TPZShapeHCurl<pzshape::TPZShapeCube>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  double local_118;
  TPZFNMatrix<9,_double> gradX;
  
  if (connectorders->fNElements != 0x13) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurl.cpp"
               ,0x19);
  }
  CalcH1ShapeOrders(connectorders,&(data->fH1ConnectOrders).super_TPZVec<int>);
  TPZShapeH1<pzshape::TPZShapeCube>::Initialize
            (ids,&(data->fH1ConnectOrders).super_TPZVec<int>,data);
  gradX.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable._0_4_ = 0;
  TPZManVector<int,_20>::Resize(&data->fSideTransformationId,0x13,(int *)&gradX);
  for (lVar3 = 0; lVar3 != 0x13; lVar3 = lVar3 + 1) {
    iVar1 = pztopology::TPZCube::GetTransformId((int)lVar3 + 8,ids);
    (data->fSideTransformationId).super_TPZVec<int>.fStore[lVar3] = iVar1;
  }
  TPZManVector<int,_27>::TPZManVector((TPZManVector<int,_27> *)&gradX,connectorders);
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)&gradX);
  TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)&gradX);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,0x13);
  iVar1 = 0;
  for (lVar3 = 0; lVar3 != 0x13; lVar3 = lVar3 + 1) {
    iVar2 = ComputeNConnectShapeF((int)lVar3,connectorders->fStore[lVar3]);
    (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar3] = iVar2;
    iVar1 = iVar1 + iVar2;
  }
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar1);
  local_118 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradX,3,3,&local_118);
  TPZMatrix<double>::Identity((TPZMatrix<double> *)&gradX);
  TPZFMatrix<double>::Redim(&(data->fMasterDirections).super_TPZFMatrix<double>,3,0x51);
  pztopology::TPZCube::ComputeHCurlDirections<double>
            (&gradX.super_TPZFMatrix<double>,&(data->fMasterDirections).super_TPZFMatrix<double>,
             &(data->fSideTransformationId).super_TPZVec<int>);
  ComputeVecandShape(data);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradX);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
    
        
    constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
    constexpr int NCorners = TSHAPE::NCornerNodes;
    constexpr int NSides = TSHAPE::NSides;
    if(connectorders.size() != ncon) DebugStop();
    CalcH1ShapeOrders(connectorders, data.fH1ConnectOrders);
    TPZShapeH1<TSHAPE>::Initialize(ids, data.fH1ConnectOrders, data);
    data.fSideTransformationId.Resize(NSides-NCorners, 0);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, ids); // Foi criado
        data.fSideTransformationId[iside-NCorners] = trans_id;
    }

    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(ncon);
    int nShape = 0;
    for (int i = 0; i < ncon; i++)
    {
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);
    TPZFNMatrix<9,REAL> gradX(TSHAPE::Dimension, TSHAPE::Dimension, 0);
    gradX.Identity();

    data.fMasterDirections.Redim(TSHAPE::Dimension, 3*NSides);
    TSHAPE::ComputeHCurlDirections(gradX,data.fMasterDirections,data.fSideTransformationId);

    ComputeVecandShape(data);
}